

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O2

char * distant_name(obj *obj,_func_char_ptr_obj_ptr *func)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = u.uprops[0x1e].intrinsic;
  u.uprops[0x1e].intrinsic = 1;
  pcVar2 = (*func)(obj);
  u.uprops[0x1e].intrinsic = uVar1;
  return pcVar2;
}

Assistant:

char *distant_name(const struct obj *obj, char *(*func)(const struct obj*))
{
	char *str;

	long save_Blinded = Blinded;
	Blinded = 1;
	str = (*func)(obj);
	Blinded = save_Blinded;
	return str;
}